

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeFtest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  uint *puVar1;
  int iVar2;
  pointer pnVar3;
  ostream *poVar4;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar5;
  uint uVar6;
  type_conflict5 tVar7;
  int iVar8;
  SPxOut *pSVar9;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar10;
  char *t;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *a;
  int i;
  long lVar11;
  long lVar12;
  Verbosity old_verbosity_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  theeps;
  long local_148;
  Verbosity local_13c;
  cpp_dec_float<100U,_int,_void> local_138;
  cpp_dec_float<100U,_int,_void> *local_e8;
  DIdxSet *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  entertol(&local_d8,this);
  this->m_pricingViolUpToDate = true;
  this->m_pricingViolCoUpToDate = true;
  local_e8 = &(this->m_pricingViol).m_backend;
  lVar12 = 0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(local_e8,0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&(this->m_pricingViolCo).m_backend,0);
  this->m_numViol = 0;
  local_e0 = &this->infeasibilities;
  (this->infeasibilities).super_IdxSet.num = 0;
  local_148 = (long)(this->thecovectors->set).thenum;
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x10;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems._56_5_ = 0;
  local_138.data._M_elems[0xf]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
            (&local_138,&(this->sparsePricingFactor).m_backend,&local_148);
  iVar8 = boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::convert_to<int>((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_138);
  for (lVar11 = 0; lVar11 < (this->thecovectors->set).thenum; lVar11 = lVar11 + 1) {
    tVar7 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)(((this->theFvec->
                                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                 _M_elems + lVar12),
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)(((this->theUBbound).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                 _M_elems + lVar12));
    pUVar10 = this->theFvec;
    pUVar5 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)&this->theLBbound;
    if (tVar7) {
      pUVar10 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)&this->theUBbound;
      pUVar5 = this->theFvec;
    }
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 0x10;
    local_138.data._M_elems[0xc] = 0;
    local_138.data._M_elems[0xd] = 0;
    local_138.data._M_elems._56_5_ = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.data._M_elems[10] = 0;
    local_138.data._M_elems[0xb] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[0xf]._1_3_ = 0;
    local_138.exp = 0;
    local_138.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_138,
               (cpp_dec_float<100U,_int,_void> *)
               ((long)(((pUVar10->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
               lVar12),(cpp_dec_float<100U,_int,_void> *)
                       ((long)(((pUVar5->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar12));
    pnVar3 = (this->theCoTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar12 + 0x30);
    *(undefined8 *)puVar1 = local_138.data._M_elems._48_8_;
    *(ulong *)(puVar1 + 2) =
         CONCAT35(local_138.data._M_elems[0xf]._1_3_,local_138.data._M_elems._56_5_);
    puVar1 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar12 + 0x20);
    *(undefined8 *)puVar1 = local_138.data._M_elems._32_8_;
    *(undefined8 *)(puVar1 + 2) = local_138.data._M_elems._40_8_;
    puVar1 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar12 + 0x10);
    *(undefined8 *)puVar1 = local_138.data._M_elems._16_8_;
    *(undefined8 *)(puVar1 + 2) = local_138.data._M_elems._24_8_;
    puVar1 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar12);
    *(undefined8 *)puVar1 = local_138.data._M_elems._0_8_;
    *(undefined8 *)(puVar1 + 2) = local_138.data._M_elems._8_8_;
    *(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar12) = local_138.exp;
    *(bool *)((long)(&(pnVar3->m_backend).data + 1) + lVar12 + 4U) = local_138.neg;
    *(undefined8 *)((long)(&(pnVar3->m_backend).data + 1) + lVar12 + 8U) = local_138._72_8_;
    a = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *)((long)(((this->theCoTest).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar12);
    local_138.data._M_elems[0xf]._1_3_ = local_d8.m_backend.data._M_elems[0xf]._1_3_;
    local_138.data._M_elems._56_5_ = local_d8.m_backend.data._M_elems._56_5_;
    local_138.data._M_elems[0] = local_d8.m_backend.data._M_elems[0];
    uVar6 = local_138.data._M_elems[0];
    if (this->remainingRoundsLeave == 0) {
      local_138.data._M_elems[0] = local_d8.m_backend.data._M_elems[0];
      local_138.data._M_elems[1] = local_d8.m_backend.data._M_elems[1];
      local_138.data._M_elems[2] = local_d8.m_backend.data._M_elems[2];
      local_138.data._M_elems[3] = local_d8.m_backend.data._M_elems[3];
      local_138.data._M_elems[0xc] = local_d8.m_backend.data._M_elems[0xc];
      local_138.data._M_elems[0xd] = local_d8.m_backend.data._M_elems[0xd];
      local_138.data._M_elems[8] = local_d8.m_backend.data._M_elems[8];
      local_138.data._M_elems[9] = local_d8.m_backend.data._M_elems[9];
      local_138.data._M_elems[10] = local_d8.m_backend.data._M_elems[10];
      local_138.data._M_elems[0xb] = local_d8.m_backend.data._M_elems[0xb];
      local_138.data._M_elems[4] = local_d8.m_backend.data._M_elems[4];
      local_138.data._M_elems[5] = local_d8.m_backend.data._M_elems[5];
      local_138.data._M_elems[6] = local_d8.m_backend.data._M_elems[6];
      local_138.data._M_elems[7] = local_d8.m_backend.data._M_elems[7];
      local_138.exp = local_d8.m_backend.exp;
      local_138.neg = local_d8.m_backend.neg;
      local_138.fpclass = local_d8.m_backend.fpclass;
      local_138.prec_elem = local_d8.m_backend.prec_elem;
      if (local_d8.m_backend.fpclass != cpp_dec_float_finite || uVar6 != 0) {
        local_138.neg = (bool)(local_d8.m_backend.neg ^ 1);
      }
      tVar7 = boost::multiprecision::operator<
                        (a,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_138);
      if (tVar7) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (local_e8,(cpp_dec_float<100U,_int,_void> *)
                            ((long)(((this->theCoTest).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                   _M_elems + lVar12));
        DIdxSet::addIdx(local_e0,(int)lVar11);
        (this->isInfeasible).data[lVar11] = 1;
        this->m_numViol = this->m_numViol + 1;
      }
      else {
        (this->isInfeasible).data[lVar11] = 0;
      }
      if (iVar8 < (this->infeasibilities).super_IdxSet.num) {
        pSVar9 = this->spxout;
        if ((pSVar9 != (SPxOut *)0x0) && (3 < (int)pSVar9->m_verbosity)) {
          local_138.data._M_elems[0] = pSVar9->m_verbosity;
          local_148 = CONCAT44(local_148._4_4_,4);
          (*pSVar9->_vptr_SPxOut[2])(pSVar9,&local_148);
          pSVar9 = soplex::operator<<(this->spxout," --- using dense pricing");
          std::endl<char,std::char_traits<char>>(pSVar9->m_streams[pSVar9->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_138);
        }
        this->remainingRoundsLeave = 5;
        this->sparsePricingLeave = false;
        (this->infeasibilities).super_IdxSet.num = 0;
      }
    }
    else {
      local_138.data._M_elems[0] = local_d8.m_backend.data._M_elems[0];
      local_138.data._M_elems[1] = local_d8.m_backend.data._M_elems[1];
      local_138.data._M_elems[2] = local_d8.m_backend.data._M_elems[2];
      local_138.data._M_elems[3] = local_d8.m_backend.data._M_elems[3];
      local_138.data._M_elems[0xc] = local_d8.m_backend.data._M_elems[0xc];
      local_138.data._M_elems[0xd] = local_d8.m_backend.data._M_elems[0xd];
      local_138.data._M_elems[8] = local_d8.m_backend.data._M_elems[8];
      local_138.data._M_elems[9] = local_d8.m_backend.data._M_elems[9];
      local_138.data._M_elems[10] = local_d8.m_backend.data._M_elems[10];
      local_138.data._M_elems[0xb] = local_d8.m_backend.data._M_elems[0xb];
      local_138.data._M_elems[4] = local_d8.m_backend.data._M_elems[4];
      local_138.data._M_elems[5] = local_d8.m_backend.data._M_elems[5];
      local_138.data._M_elems[6] = local_d8.m_backend.data._M_elems[6];
      local_138.data._M_elems[7] = local_d8.m_backend.data._M_elems[7];
      local_138.exp = local_d8.m_backend.exp;
      local_138.neg = local_d8.m_backend.neg;
      local_138.fpclass = local_d8.m_backend.fpclass;
      local_138.prec_elem = local_d8.m_backend.prec_elem;
      if (local_d8.m_backend.fpclass != cpp_dec_float_finite || uVar6 != 0) {
        local_138.neg = (bool)(local_d8.m_backend.neg ^ 1);
      }
      tVar7 = boost::multiprecision::operator<
                        (a,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_138);
      if (tVar7) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (local_e8,(cpp_dec_float<100U,_int,_void> *)
                            ((long)(((this->theCoTest).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                   _M_elems + lVar12));
        this->m_numViol = this->m_numViol + 1;
      }
    }
    lVar12 = lVar12 + 0x50;
  }
  iVar2 = (this->infeasibilities).super_IdxSet.num;
  if ((iVar2 == 0) && (this->sparsePricingLeave == false)) {
    this->remainingRoundsLeave = this->remainingRoundsLeave + -1;
  }
  else if ((iVar2 <= iVar8) && (this->sparsePricingLeave == false)) {
    pSVar9 = this->spxout;
    if ((pSVar9 != (SPxOut *)0x0) && (local_13c = pSVar9->m_verbosity, 3 < (int)local_13c)) {
      local_138.data._M_elems[0] = 4;
      (*pSVar9->_vptr_SPxOut[2])();
      pSVar9 = this->spxout;
      iVar8 = *(int *)(pSVar9->m_streams[pSVar9->m_verbosity] +
                      *(long *)(*(long *)pSVar9->m_streams[pSVar9->m_verbosity] + -0x18) + 8);
      t = " --- using sparse pricing, ";
      if (this->hyperPricingLeave != false) {
        t = " --- using hypersparse pricing, ";
      }
      soplex::operator<<(pSVar9,t);
      pSVar9 = soplex::operator<<(this->spxout,"sparsity: ");
      poVar4 = pSVar9->m_streams[pSVar9->m_verbosity];
      lVar11 = *(long *)poVar4;
      *(undefined8 *)(poVar4 + *(long *)(lVar11 + -0x18) + 0x10) = 6;
      *(uint *)(poVar4 + *(long *)(lVar11 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(lVar11 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar4 + *(long *)(lVar11 + -0x18) + 8) = 4;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_138,(long)this->m_numViol,(type *)0x0);
      local_148 = (long)(this->thecovectors->set).thenum;
      local_88.fpclass = cpp_dec_float_finite;
      local_88.prec_elem = 0x10;
      local_88.data._M_elems[0] = 0;
      local_88.data._M_elems[1] = 0;
      local_88.data._M_elems[2] = 0;
      local_88.data._M_elems[3] = 0;
      local_88.data._M_elems[0xc] = 0;
      local_88.data._M_elems[0xd] = 0;
      local_88.data._M_elems._56_5_ = 0;
      local_88.data._M_elems[0xf]._1_3_ = 0;
      local_88.exp = 0;
      local_88.neg = false;
      local_88.data._M_elems[4] = 0;
      local_88.data._M_elems[5] = 0;
      local_88.data._M_elems[6] = 0;
      local_88.data._M_elems[7] = 0;
      local_88.data._M_elems[8] = 0;
      local_88.data._M_elems[9] = 0;
      local_88.data._M_elems[10] = 0;
      local_88.data._M_elems[0xb] = 0;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
                (&local_88,&local_138,&local_148);
      pSVar9 = soplex::operator<<(pSVar9,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_88);
      poVar4 = pSVar9->m_streams[pSVar9->m_verbosity];
      lVar11 = *(long *)poVar4;
      lVar12 = *(long *)(lVar11 + -0x18);
      *(uint *)(poVar4 + lVar12 + 0x18) = *(uint *)(poVar4 + lVar12 + 0x18) & 0xfffffefb | 0x100;
      *(long *)(poVar4 + *(long *)(lVar11 + -0x18) + 8) = (long)iVar8;
      std::endl<char,std::char_traits<char>>(poVar4);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_13c);
    }
    this->sparsePricingLeave = true;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeFtest()
{

   assert(type() == LEAVE);

   R theeps = entertol();
   m_pricingViolUpToDate = true;
   m_pricingViolCoUpToDate = true;
   m_pricingViol = 0;
   m_pricingViolCo = 0;
   m_numViol = 0;
   infeasibilities.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * dim());

   for(int i = 0; i < dim(); ++i)
   {
      theCoTest[i] = ((*theFvec)[i] > theUBbound[i])
                     ? theUBbound[i] - (*theFvec)[i]
                     : (*theFvec)[i] - theLBbound[i];

      if(remainingRoundsLeave == 0)
      {
         if(theCoTest[i] < -theeps)
         {
            m_pricingViol -= theCoTest[i];
            infeasibilities.addIdx(i);
            isInfeasible[i] = SPxPricer<R>::VIOLATED;
            ++m_numViol;
         }
         else
            isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;

         if(infeasibilities.size() > sparsitythreshold)
         {
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                          << std::endl;)
            remainingRoundsLeave = SOPLEX_DENSEROUNDS;
            sparsePricingLeave = false;
            infeasibilities.clear();
         }
      }
      else if(theCoTest[i] < -theeps)
      {
         m_pricingViol -= theCoTest[i];
         m_numViol++;
      }
   }

   if(infeasibilities.size() == 0 && !sparsePricingLeave)
   {
      --remainingRoundsLeave;
   }
   else if(infeasibilities.size() <= sparsitythreshold && !sparsePricingLeave)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingLeave)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) m_numViol / dim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingLeave = true;
   }
}